

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O2

void __thiscall embree::TokenStream::skipSeparators(TokenStream *this)

{
  int *piVar1;
  uint *puVar2;
  
  while( true ) {
    piVar1 = Stream<int>::peek((this->cin).ptr);
    if (*piVar1 == -1) {
      return;
    }
    puVar2 = (uint *)Stream<int>::peek((this->cin).ptr);
    if (0xff < (ulong)*puVar2) break;
    if (this->isSepMap[*puVar2] != true) {
      return;
    }
    Stream<int>::drop((this->cin).ptr);
  }
  return;
}

Assistant:

void TokenStream::skipSeparators()
  {
    /* skip separators */
    while (cin->peek() != EOF && isSeparator(cin->peek()))
      cin->drop();
  }